

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>_>::rehash
          (Data<QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>_> *this,size_t sizeHint)

{
  Entry *pEVar1;
  ulong uVar2;
  Span *pSVar3;
  Entry *pEVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  Data *pDVar8;
  ulong uVar9;
  Node<QString,_QtInstallDirectoryWithTriple> *pNVar10;
  ulong uVar11;
  size_t index;
  long lVar12;
  size_t sVar13;
  long lVar14;
  QStringView QVar15;
  R RVar16;
  Bucket BVar17;
  Span *local_50;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  sVar13 = 0x80;
  if ((0x40 < sizeHint) && (sVar13 = 0xffffffffffffffff, sizeHint < 0x4000000000000000)) {
    lVar12 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    sVar13 = 1L << (0x41 - ((byte)lVar12 ^ 0x3f) & 0x3f);
  }
  uVar2 = this->numBuckets;
  pSVar3 = this->spans;
  RVar16 = allocateSpans(sVar13);
  this->spans = (Span *)RVar16.spans;
  this->numBuckets = sVar13;
  if (uVar2 < 0x80) {
    if (pSVar3 == (Span *)0x0) {
      return;
    }
  }
  else {
    uVar11 = 0;
    local_50 = pSVar3;
    do {
      lVar12 = 0;
      do {
        uVar9 = (ulong)local_50->offsets[lVar12];
        if (uVar9 != 0xff) {
          pEVar4 = pSVar3[uVar11].entries;
          QVar15.m_data = *(storage_type **)(pEVar4[uVar9].storage.data + 8);
          QVar15.m_size = *(qsizetype *)(pEVar4[uVar9].storage.data + 0x10);
          sVar13 = qHash(QVar15,this->seed);
          BVar17 = findBucketWithHash<QString>(this,(QString *)(pEVar4 + uVar9),sVar13);
          pNVar10 = Span<QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>_>::insert
                              (BVar17.span,BVar17.index);
          pDVar5 = *(Data **)pEVar4[uVar9].storage.data;
          pEVar1 = pEVar4 + uVar9;
          (pEVar1->storage).data[0] = '\0';
          (pEVar1->storage).data[1] = '\0';
          (pEVar1->storage).data[2] = '\0';
          (pEVar1->storage).data[3] = '\0';
          (pEVar1->storage).data[4] = '\0';
          (pEVar1->storage).data[5] = '\0';
          (pEVar1->storage).data[6] = '\0';
          (pEVar1->storage).data[7] = '\0';
          (pNVar10->key).d.d = pDVar5;
          pcVar6 = *(char16_t **)(pEVar4[uVar9].storage.data + 8);
          pEVar1 = pEVar4 + uVar9;
          (pEVar1->storage).data[8] = '\0';
          (pEVar1->storage).data[9] = '\0';
          (pEVar1->storage).data[10] = '\0';
          (pEVar1->storage).data[0xb] = '\0';
          (pEVar1->storage).data[0xc] = '\0';
          (pEVar1->storage).data[0xd] = '\0';
          (pEVar1->storage).data[0xe] = '\0';
          (pEVar1->storage).data[0xf] = '\0';
          (pNVar10->key).d.ptr = pcVar6;
          qVar7 = *(qsizetype *)(pEVar4[uVar9].storage.data + 0x10);
          pEVar1 = pEVar4 + uVar9;
          (pEVar1->storage).data[0x10] = '\0';
          (pEVar1->storage).data[0x11] = '\0';
          (pEVar1->storage).data[0x12] = '\0';
          (pEVar1->storage).data[0x13] = '\0';
          (pEVar1->storage).data[0x14] = '\0';
          (pEVar1->storage).data[0x15] = '\0';
          (pEVar1->storage).data[0x16] = '\0';
          (pEVar1->storage).data[0x17] = '\0';
          (pNVar10->key).d.size = qVar7;
          pDVar5 = *(Data **)(pEVar4[uVar9].storage.data + 0x18);
          pEVar1 = pEVar4 + uVar9;
          (pEVar1->storage).data[0x18] = '\0';
          (pEVar1->storage).data[0x19] = '\0';
          (pEVar1->storage).data[0x1a] = '\0';
          (pEVar1->storage).data[0x1b] = '\0';
          (pEVar1->storage).data[0x1c] = '\0';
          (pEVar1->storage).data[0x1d] = '\0';
          (pEVar1->storage).data[0x1e] = '\0';
          (pEVar1->storage).data[0x1f] = '\0';
          (pNVar10->value).qtInstallDirectory.d.d = pDVar5;
          pcVar6 = *(char16_t **)(pEVar4[uVar9].storage.data + 0x20);
          pEVar1 = pEVar4 + uVar9;
          (pEVar1->storage).data[0x20] = '\0';
          (pEVar1->storage).data[0x21] = '\0';
          (pEVar1->storage).data[0x22] = '\0';
          (pEVar1->storage).data[0x23] = '\0';
          (pEVar1->storage).data[0x24] = '\0';
          (pEVar1->storage).data[0x25] = '\0';
          (pEVar1->storage).data[0x26] = '\0';
          (pEVar1->storage).data[0x27] = '\0';
          (pNVar10->value).qtInstallDirectory.d.ptr = pcVar6;
          qVar7 = *(qsizetype *)(pEVar4[uVar9].storage.data + 0x28);
          pEVar1 = pEVar4 + uVar9;
          (pEVar1->storage).data[0x28] = '\0';
          (pEVar1->storage).data[0x29] = '\0';
          (pEVar1->storage).data[0x2a] = '\0';
          (pEVar1->storage).data[0x2b] = '\0';
          (pEVar1->storage).data[0x2c] = '\0';
          (pEVar1->storage).data[0x2d] = '\0';
          (pEVar1->storage).data[0x2e] = '\0';
          (pEVar1->storage).data[0x2f] = '\0';
          (pNVar10->value).qtInstallDirectory.d.size = qVar7;
          pDVar8 = *(Data **)(pEVar4[uVar9].storage.data + 0x30);
          pEVar1 = pEVar4 + uVar9;
          (pEVar1->storage).data[0x30] = '\0';
          (pEVar1->storage).data[0x31] = '\0';
          (pEVar1->storage).data[0x32] = '\0';
          (pEVar1->storage).data[0x33] = '\0';
          (pEVar1->storage).data[0x34] = '\0';
          (pEVar1->storage).data[0x35] = '\0';
          (pEVar1->storage).data[0x36] = '\0';
          (pEVar1->storage).data[0x37] = '\0';
          (pNVar10->value).qtDirectories.d = pDVar8;
          pDVar5 = *(Data **)(pEVar4[uVar9].storage.data + 0x38);
          pEVar1 = pEVar4 + uVar9;
          (pEVar1->storage).data[0x38] = '\0';
          (pEVar1->storage).data[0x39] = '\0';
          (pEVar1->storage).data[0x3a] = '\0';
          (pEVar1->storage).data[0x3b] = '\0';
          (pEVar1->storage).data[0x3c] = '\0';
          (pEVar1->storage).data[0x3d] = '\0';
          (pEVar1->storage).data[0x3e] = '\0';
          (pEVar1->storage).data[0x3f] = '\0';
          (pNVar10->value).triple.d.d = pDVar5;
          pcVar6 = *(char16_t **)(pEVar4[uVar9].storage.data + 0x40);
          pEVar1 = pEVar4 + uVar9;
          (pEVar1->storage).data[0x40] = '\0';
          (pEVar1->storage).data[0x41] = '\0';
          (pEVar1->storage).data[0x42] = '\0';
          (pEVar1->storage).data[0x43] = '\0';
          (pEVar1->storage).data[0x44] = '\0';
          (pEVar1->storage).data[0x45] = '\0';
          (pEVar1->storage).data[0x46] = '\0';
          (pEVar1->storage).data[0x47] = '\0';
          (pNVar10->value).triple.d.ptr = pcVar6;
          qVar7 = *(qsizetype *)(pEVar4[uVar9].storage.data + 0x48);
          pEVar1 = pEVar4 + uVar9;
          (pEVar1->storage).data[0x48] = '\0';
          (pEVar1->storage).data[0x49] = '\0';
          (pEVar1->storage).data[0x4a] = '\0';
          (pEVar1->storage).data[0x4b] = '\0';
          (pEVar1->storage).data[0x4c] = '\0';
          (pEVar1->storage).data[0x4d] = '\0';
          (pEVar1->storage).data[0x4e] = '\0';
          (pEVar1->storage).data[0x4f] = '\0';
          (pNVar10->value).triple.d.size = qVar7;
          (pNVar10->value).enabled = (bool)pEVar4[uVar9].storage.data[0x50];
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x80);
      Span<QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>_>::freeData(pSVar3 + uVar11);
      uVar11 = uVar11 + 1;
      local_50 = local_50 + 1;
    } while (uVar11 != uVar2 >> 7);
  }
  lVar12 = *(long *)&pSVar3[-1].allocated;
  if (lVar12 != 0) {
    lVar14 = lVar12 * 0x90;
    do {
      Span<QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>_>::freeData
                ((Span<QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>_> *)
                 (pSVar3[-1].offsets + lVar14));
      lVar14 = lVar14 + -0x90;
    } while (lVar14 != 0);
  }
  operator_delete__(&pSVar3[-1].allocated,lVar12 * 0x90 + 8);
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }